

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O0

void __thiscall bidirectional::BiDirectional::checkCriticalRes(BiDirectional *this)

{
  double dVar1;
  format_string_t<int_&,_int_&> fmt;
  element_type *peVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  pointer pPVar6;
  vector<double,_std::allocator<double>_> *in_RDI;
  undefined8 uVar7;
  source_loc in_stack_00000000;
  double *diff;
  int r;
  int min_r;
  double min_diff;
  vector<double,_std::allocator<double>_> *res;
  int *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  _func_int **in_stack_ffffffffffffffd0;
  level_enum lvl;
  _Alloc_hider in_stack_ffffffffffffffd8;
  int iVar8;
  int iVar9;
  int iVar10;
  
  peVar2 = std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x244878);
  uVar7 = std::numeric_limits<double>::infinity();
  iVar9 = 0;
  iVar8 = 0;
  while( true ) {
    lvl = (level_enum)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
    uVar3 = (ulong)iVar8;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&peVar2->resource_consumption);
    if (sVar4 <= uVar3) break;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)iVar8);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&peVar2->resource_consumption,(long)iVar8);
    in_stack_ffffffffffffffd0 = (_func_int **)(dVar1 - *pvVar5);
    in_stack_ffffffffffffffd8._M_p = &stack0xffffffffffffffd0;
    if ((double)in_stack_ffffffffffffffd0 < (double)uVar7) {
      iVar9 = iVar8;
      uVar7 = in_stack_ffffffffffffffd0;
    }
    iVar8 = iVar8 + 1;
  }
  iVar10 = iVar9;
  pPVar6 = std::unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>::
           operator->((unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
                       *)0x244969);
  if (iVar9 != pPVar6->critical_res) {
    spdlog::default_logger_raw();
    spdlog::source_loc::source_loc
              ((source_loc *)&stack0xffffffffffffffb8,
               "/workspace/llm4binary/github/license_c_cmakelists/torressa[P]cspy/src/cc/bidirectional.cc"
               ,0x44,"checkCriticalRes");
    std::unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>::operator->
              ((unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_> *)
               0x2449c3);
    fmt.str.data_._4_4_ = iVar10;
    fmt.str.data_._0_4_ = iVar8;
    fmt.str.size_ = uVar7;
    spdlog::logger::log<int&,int&>
              ((logger *)in_stack_ffffffffffffffd8._M_p,in_stack_00000000,lvl,fmt,
               in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void BiDirectional::checkCriticalRes() const {
  const std::vector<double>& res      = best_label_->resource_consumption;
  double                     min_diff = std::numeric_limits<double>::infinity();
  int                        min_r    = 0;
  for (int r = 0; r < res.size(); r++) {
    const double& diff = max_res[r] - res[r];
    if (diff < min_diff) {
      min_diff = diff;
      min_r    = r;
    }
  }
  if (min_r != params_ptr_->critical_res)
    SPDLOG_WARN(
        "Critical resource {} does not match final tighest {}",
        params_ptr_->critical_res,
        min_r);
}